

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

_Bool object_curses_find_flags(player *p,object *obj,bitflag *test_flags)

{
  _Bool _Var1;
  int flag;
  angband_constants *paVar2;
  size_t sVar3;
  int *piVar4;
  long lVar5;
  size_t sVar6;
  angband_constants *paVar7;
  bitflag f [5];
  char o_name [80];
  bitflag local_8d [5];
  char local_88 [88];
  
  paVar2 = (angband_constants *)object_desc(local_88,0x50,obj,0,p);
  if ((obj->curses != (curse_data *)0x0) && (paVar2 = z_info, 1 < z_info->curse_max)) {
    paVar7 = (angband_constants *)0x1;
    do {
      if ((obj->curses[(long)paVar7].power != L'\0') && (curses[(long)paVar7].obj != (object *)0x0))
      {
        object_flags(curses[(long)paVar7].obj,local_8d);
        flag_inter(local_8d,test_flags,5);
        for (flag = flag_next(local_8d,5,1); flag != 0; flag = flag_next(local_8d,5,flag + 1)) {
          _Var1 = flag_has_dbg(p->obj_k->flags,5,flag,"p->obj_k->flags","flag");
          if (!_Var1) {
            sVar6 = 0xffffffffffffffff;
            if (rune_max != 0) {
              piVar4 = &rune_list->index;
              lVar5 = 0;
              sVar3 = rune_max;
              do {
                if ((((rune *)(piVar4 + -1))->variety == RUNE_VAR_FLAG) && (*piVar4 == flag)) {
                  sVar6 = lVar5 >> 0x20;
                  break;
                }
                lVar5 = lVar5 + 0x100000000;
                piVar4 = piVar4 + 6;
                sVar3 = sVar3 - 1;
              } while (sVar3 != 0);
            }
            player_learn_rune(p,sVar6,true);
            if (p->upkeep->playing == true) {
              flag_message(flag,local_88);
            }
          }
          if (rune_max != 0) {
            piVar4 = &rune_list->index;
            sVar6 = 0;
            do {
              if ((((rune *)(piVar4 + -1))->variety == RUNE_VAR_CURSE) &&
                 (paVar7 == (angband_constants *)(ulong)(uint)*piVar4)) {
                if (-1 < (int)(uint)sVar6) {
                  player_learn_rune(p,(ulong)((uint)sVar6 & 0x7fffffff),true);
                }
                break;
              }
              sVar6 = sVar6 + 1;
              piVar4 = piVar4 + 6;
            } while (rune_max != sVar6);
          }
        }
      }
      paVar7 = (angband_constants *)((long)&paVar7->store_max + 1);
      paVar2 = (angband_constants *)(ulong)z_info->curse_max;
    } while (paVar7 < paVar2);
  }
  return SUB81(paVar2,0);
}

Assistant:

static bool object_curses_find_flags(struct player *p, struct object *obj,
							  bitflag *test_flags)
{
	char o_name[80];
	bool new = false;

	object_desc(o_name, sizeof(o_name), obj, ODESC_BASE, p);
	if (obj->curses) {
		int i;
		int index;
		bitflag f[OF_SIZE];
		int flag;

		for (i = 1; i < z_info->curse_max; i++) {
			if (!obj->curses[i].power || !curses[i].obj)
				continue;

			/* Get all the relevant flags */
			object_flags(curses[i].obj, f);
			of_inter(f, test_flags);
			for (flag = of_next(f, FLAG_START); flag != FLAG_END;
				 flag = of_next(f, flag + 1)) {
				/* Learn any new flags */
				if (!of_has(p->obj_k->flags, flag)) {
					new = true;
					player_learn_rune(p, rune_index(RUNE_VAR_FLAG, flag), true);
					if (p->upkeep->playing) {
						flag_message(flag, o_name);
					}
				}

				/* Learn the curse */
				index = rune_index(RUNE_VAR_CURSE, i);
				if (index >= 0) {
					player_learn_rune(p, index, true);
				}
			}
		}
	}

	return new;
}